

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O2

void __thiscall gurkenlaeufer::Parser::parseFile(Parser *this,string *filePath)

{
  invalid_argument *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ifstream fin;
  byte abStack_208 [488];
  
  std::ifstream::ifstream(&fin,(string *)filePath,_S_in);
  if ((abStack_208[*(long *)(_fin + -0x18)] & 5) == 0) {
    parseStream(this,(istream *)&fin);
    std::ifstream::~ifstream(&fin);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_268,"The given cucumber feature file \'",filePath);
  std::operator+(&local_248,&bStack_268,"\' can not be opened!");
  std::invalid_argument::invalid_argument(this_00,(string *)&local_248);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void parseFile(const std::string& filePath)
    {
        std::ifstream fin(filePath);
        if (fin.fail()) {
            throw std::invalid_argument("The given cucumber feature file '" + filePath + "' can not be opened!");
        }
        parseStream(&fin);
    }